

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:170:38)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:170:38)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  function_object *this_00;
  bound_function_args *pbVar1;
  gc_heap_ptr<mjs::bound_function_args> *this_01;
  vector<mjs::value,_std::allocator<mjs::value>_> local_60;
  value local_48;
  
  this_00 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  this_01 = &(this->f).bound_args;
  pbVar1 = (bound_function_args *)gc_heap_ptr_untyped::get(&this_01->super_gc_heap_ptr_untyped);
  bound_function_args::bound_this(&local_48,pbVar1);
  pbVar1 = (bound_function_args *)gc_heap_ptr_untyped::get(&this_01->super_gc_heap_ptr_untyped);
  bound_function_args::build_args(&local_60,pbVar1,args);
  function_object::call(__return_storage_ptr__,this_00,&local_48,&local_60);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_60);
  value::~value(&local_48);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }